

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

uint32_t tinyusdz::detail::utf8_len(uchar c)

{
  undefined4 local_c;
  uchar c_local;
  
  if (c < 0x80) {
    local_c = 1;
  }
  else if ((c & 0xe0) == 0xc0) {
    local_c = 2;
  }
  else if ((c & 0xf0) == 0xe0) {
    local_c = 3;
  }
  else if ((c & 0xf8) == 0xf0) {
    local_c = 4;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

inline uint32_t utf8_len(const unsigned char c) {
      if (c <= 127) {
        // ascii
        return 1;
      } else if ((c & 0xE0) == 0xC0) {
        return 2;
      } else if ((c & 0xF0) == 0xE0) {
        return 3;
      } else if ((c & 0xF8) == 0xF0) {
        return 4;
      }

      // invalid
      return 0;
}